

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O3

Error __thiscall asmjit::CodeEmitter::setLastError(CodeEmitter *this,Error error,char *message)

{
  ErrorHandler *pEVar1;
  int iVar2;
  CodeHolder *pCVar3;
  
  pCVar3 = this->_code;
  if (pCVar3 == (CodeHolder *)0x0) {
    setLastError();
  }
  if (error == 0) {
    this->_lastError = 0;
    *(byte *)&this->_globalOptions = (byte)this->_globalOptions & 0xfe;
  }
  else {
    if (message == (char *)0x0) {
      message = DebugUtils::errorAsString(error);
      pCVar3 = this->_code;
    }
    pEVar1 = pCVar3->_errorHandler;
    if ((pEVar1 != (ErrorHandler *)0x0) &&
       (iVar2 = (*pEVar1->_vptr_ErrorHandler[2])(pEVar1,error,message,this), (char)iVar2 != '\0')) {
      return error;
    }
    this->_lastError = error;
    *(byte *)&this->_globalOptions = (byte)this->_globalOptions | 1;
  }
  return error;
}

Assistant:

Error CodeEmitter::setLastError(Error error, const char* message) {
  // This is fatal, CodeEmitter can't set error without being attached to `CodeHolder`.
  ASMJIT_ASSERT(_code != nullptr);

  // Special case used to reset the last error.
  if (error == kErrorOk) {
    _lastError = kErrorOk;
    _globalOptions &= ~kOptionMaybeFailureCase;
    return kErrorOk;
  }

  if (!message)
    message = DebugUtils::errorAsString(error);

  // Logging is skipped if the error is handled by `ErrorHandler`.
  ErrorHandler* handler = _code->_errorHandler;
  if (handler && handler->handleError(error, message, this))
    return error;

  // The handler->handleError() function may throw an exception or longjmp()
  // to terminate the execution of `setLastError()`. This is the reason why
  // we have delayed changing the `_error` member until now.
  _lastError = error;
  _globalOptions |= kOptionMaybeFailureCase;

  return error;
}